

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::detail::
int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned___int128>::
on_num(int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned___int128>
       *this)

{
  char cVar1;
  undefined1 n [16];
  num_writer f;
  int num_digits_00;
  char cVar2;
  bool bVar3;
  char cVar4;
  bool bVar5;
  ulong uVar6;
  reference pcVar7;
  char *pcVar8;
  back_insert_iterator<fmt::v6::detail::buffer<char>_> bVar9;
  string_view prefix;
  undefined8 in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffec0;
  undefined4 uStack_d4;
  undefined7 uStack_c7;
  undefined8 uStack_c0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  const_iterator group;
  int size;
  int local_5c;
  int num_digits;
  char sep;
  detail local_30 [8];
  string groups;
  int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned___int128>
  *this_local;
  
  grouping<char>(local_30,(locale_ref)(this->locale).locale_);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    cVar2 = thousands_sep<char>((locale_ref)(this->locale).locale_);
    if (cVar2 == '\0') {
      on_dec(this);
    }
    else {
      n._8_8_ = in_stack_fffffffffffffec0;
      n._0_8_ = in_stack_fffffffffffffeb8;
      local_5c = count_digits(*(detail **)&this->abs_value,(uint128_t)n);
      group._M_current._4_4_ = local_5c;
      local_88._M_current = (char *)std::__cxx11::string::cbegin();
      while( true ) {
        local_90._M_current = (char *)std::__cxx11::string::cend();
        bVar3 = __gnu_cxx::operator!=(&local_88,&local_90);
        bVar5 = false;
        if (bVar3) {
          pcVar7 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_88);
          bVar5 = false;
          if (*pcVar7 < local_5c) {
            pcVar7 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_88);
            bVar5 = false;
            if ('\0' < *pcVar7) {
              pcVar7 = __gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(&local_88);
              cVar1 = *pcVar7;
              cVar4 = max_value<char>();
              bVar5 = cVar1 != cVar4;
            }
          }
        }
        if (!bVar5) break;
        group._M_current._4_4_ = group._M_current._4_4_ + 1;
        pcVar7 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_88);
        local_5c = local_5c - *pcVar7;
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_88);
      }
      local_98._M_current = (char *)std::__cxx11::string::cend();
      bVar5 = __gnu_cxx::operator==(&local_88,&local_98);
      if (bVar5) {
        pcVar8 = (char *)std::__cxx11::string::back();
        group._M_current._4_4_ = (local_5c + -1) / (int)*pcVar8 + group._M_current._4_4_;
      }
      num_digits_00 = group._M_current._4_4_;
      bVar9.container = (this->out).container;
      prefix = get_prefix(this);
      f._20_4_ = uStack_d4;
      f.size = group._M_current._4_4_;
      f._33_7_ = uStack_c7;
      f.sep = cVar2;
      f.abs_value = this->abs_value;
      f.groups = (string *)local_30;
      f._40_8_ = uStack_c0;
      bVar9 = write_int<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char,fmt::v6::detail::int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char,unsigned__int128>::num_writer>
                        (bVar9,num_digits_00,prefix,this->specs,f);
      (this->out).container = bVar9.container;
    }
  }
  else {
    on_dec(this);
  }
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && num_digits > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      num_digits -= *group;
      ++group;
    }
    if (group == groups.cend())
      size += sep_size * ((num_digits - 1) / groups.back());
    out = write_int(out, size, get_prefix(), specs,
                    num_writer{abs_value, size, groups, sep});
  }